

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O2

void __thiscall
MeCab::Allocator<mecab_node_t,_mecab_path_t>::~Allocator
          (Allocator<mecab_node_t,_mecab_path_t> *this)

{
  this->_vptr_Allocator = (_func_int **)&PTR__Allocator_0019ea28;
  scoped_array<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::result_pair_type>
  ::~scoped_array(&this->results_);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->partial_buffer_).super__Vector_base<char,_std::allocator<char>_>);
  scoped_ptr<MeCab::NBestGenerator>::~scoped_ptr(&this->nbest_generator_);
  scoped_ptr<MeCab::ChunkFreeList<char>_>::~scoped_ptr(&this->char_freelist_);
  scoped_ptr<MeCab::FreeList<mecab_path_t>_>::~scoped_ptr(&this->path_freelist_);
  scoped_ptr<MeCab::FreeList<mecab_node_t>_>::~scoped_ptr(&this->node_freelist_);
  return;
}

Assistant:

virtual ~Allocator() {}